

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_bitst.cc
# Opt level: O0

ASN1_BIT_STRING *
v2i_ASN1_BIT_STRING(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  int iVar1;
  CONF_VALUE *pCVar2;
  int *local_48;
  BIT_STRING_BITNAME *bnam;
  CONF_VALUE *val;
  size_t i;
  ASN1_BIT_STRING *bs;
  stack_st_CONF_VALUE *nval_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  method_local = (X509V3_EXT_METHOD *)ASN1_BIT_STRING_new();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    for (val = (CONF_VALUE *)0x0;
        pCVar2 = (CONF_VALUE *)sk_CONF_VALUE_num((stack_st_CONF_VALUE *)nval), val < pCVar2;
        val = (CONF_VALUE *)((long)&val->section + 1)) {
      pCVar2 = sk_CONF_VALUE_value((stack_st_CONF_VALUE *)nval,(size_t)val);
      for (local_48 = (int *)method->usr_data; *(long *)(local_48 + 2) != 0; local_48 = local_48 + 6
          ) {
        iVar1 = strcmp(*(char **)(local_48 + 4),pCVar2->name);
        if ((iVar1 == 0) || (iVar1 = strcmp(*(char **)(local_48 + 2),pCVar2->name), iVar1 == 0)) {
          iVar1 = ASN1_BIT_STRING_set_bit((ASN1_BIT_STRING *)method_local,*local_48,1);
          if (iVar1 == 0) {
            ASN1_BIT_STRING_free((ASN1_BIT_STRING *)method_local);
            return (ASN1_BIT_STRING *)0x0;
          }
          break;
        }
      }
      if (*(long *)(local_48 + 2) == 0) {
        ERR_put_error(0x14,0,0x9c,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_bitst.cc"
                      ,0x54);
        ERR_add_error_data(6,"section:",pCVar2->section,",name:",pCVar2->name,",value:",
                           pCVar2->value);
        ASN1_BIT_STRING_free((ASN1_BIT_STRING *)method_local);
        return (ASN1_BIT_STRING *)0x0;
      }
    }
  }
  return (ASN1_BIT_STRING *)method_local;
}

Assistant:

static void *v2i_ASN1_BIT_STRING(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  ASN1_BIT_STRING *bs;
  if (!(bs = ASN1_BIT_STRING_new())) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    const BIT_STRING_BITNAME *bnam;
    for (bnam = reinterpret_cast<const BIT_STRING_BITNAME *>(method->usr_data);
         bnam->lname; bnam++) {
      if (!strcmp(bnam->sname, val->name) || !strcmp(bnam->lname, val->name)) {
        if (!ASN1_BIT_STRING_set_bit(bs, bnam->bitnum, 1)) {
          ASN1_BIT_STRING_free(bs);
          return NULL;
        }
        break;
      }
    }
    if (!bnam->lname) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_UNKNOWN_BIT_STRING_ARGUMENT);
      X509V3_conf_err(val);
      ASN1_BIT_STRING_free(bs);
      return NULL;
    }
  }
  return bs;
}